

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

Aig_Man_t *
LivenessToSafetyTransformationWithLTL
          (int mode,Abc_Ntk_t *pNtk,Aig_Man_t *p,Vec_Ptr_t *vLive,Vec_Ptr_t *vFair,
          Vec_Ptr_t *vAssertSafety,Vec_Ptr_t *vAssumeSafety,int *numLtlProcessed,
          Vec_Ptr_t *ltlBuffer)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ltlNode *plVar7;
  Aig_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Aig_Obj_t *pAVar10;
  char *pcVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  Aig_Obj_t *pAVar14;
  Aig_Obj_t *pAVar15;
  uint *puVar16;
  void *pvVar17;
  uint *puVar18;
  Vec_Vec_t *vAigGFMap;
  Aig_Obj_t *pAVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint *local_b8;
  Aig_Obj_t *local_90;
  Aig_Obj_t *local_80;
  uint *local_78;
  Aig_Obj_t *local_70;
  Aig_Obj_t *local_68;
  
  uVar4 = p->nTruePis;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar25 = 8;
  if (6 < uVar4) {
    iVar25 = uVar4 + 1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar25;
  if (iVar25 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar25 * 8);
  }
  pVVar5->pArray = ppvVar6;
  vecPis = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar25;
  if (iVar25 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar25 << 3);
  }
  pVVar5->pArray = ppvVar6;
  iVar3 = p->nRegs * 2 + vLive->nSize;
  iVar25 = vFair->nSize;
  vecPiNames = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar23 = 8;
  if (6 < (uint)(iVar3 + iVar25)) {
    iVar23 = iVar25 + iVar3 + 1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar23;
  if (iVar23 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar23 * 8);
  }
  pVVar5->pArray = ppvVar6;
  vecLos = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar23;
  if (iVar23 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar23 << 3);
  }
  pVVar5->pArray = ppvVar6;
  vecLoNames = pVVar5;
  *numLtlProcessed = 0;
  if ((mode & 0xfffffffdU) == 0) {
    if (ltlBuffer == (Vec_Ptr_t *)0x0) {
      local_b8 = (uint *)0x0;
    }
    else {
      uVar4 = ltlBuffer->nSize;
      local_b8 = (uint *)malloc(0x10);
      uVar20 = 8;
      if (6 < uVar4 - 1) {
        uVar20 = uVar4;
      }
      local_b8[1] = 0;
      *local_b8 = uVar20;
      if (uVar20 == 0) {
        pvVar17 = (void *)0x0;
      }
      else {
        pvVar17 = malloc((long)(int)uVar20 << 3);
      }
      *(void **)(local_b8 + 2) = pvVar17;
      putchar(10);
      if (0 < ltlBuffer->nSize) {
        lVar27 = 0;
        do {
          plVar7 = parseFormulaCreateAST((char *)ltlBuffer->pArray[lVar27]);
          if (plVar7 == (ltlNode *)0x0) {
            pcVar11 = "\nNo AST has been created for formula %d, no extra logic will be added\n";
LAB_00624865:
            printf(pcVar11,(ulong)((int)lVar27 + 1));
          }
          else {
            printf("Formula %d: AST is created, ",(ulong)((int)lVar27 + 1));
            iVar25 = isWellFormed(plVar7);
            if (iVar25 == 0) {
              puts("Well-formedness check FAILED!!");
LAB_0062485a:
              pcVar11 = 
              "AST will be ignored for formula %d, no extra logic will be added for this formula\n";
              goto LAB_00624865;
            }
            printf("Well-formedness check PASSED, ");
            iVar25 = checkSignalNameExistence(pNtk,plVar7);
            if (iVar25 == 0) {
              printf("Signal check FAILED!!");
              goto LAB_0062485a;
            }
            puts("Signal check PASSED");
            uVar4 = local_b8[1];
            uVar20 = *local_b8;
            if (uVar4 == uVar20) {
              if ((int)uVar20 < 0x10) {
                if (*(void **)(local_b8 + 2) == (void *)0x0) {
                  pvVar17 = malloc(0x80);
                }
                else {
                  pvVar17 = realloc(*(void **)(local_b8 + 2),0x80);
                }
                uVar22 = 0x10;
              }
              else {
                uVar22 = uVar20 * 2;
                if ((int)uVar22 <= (int)uVar20) goto LAB_006248ad;
                if (*(void **)(local_b8 + 2) == (void *)0x0) {
                  pvVar17 = malloc((ulong)uVar20 << 4);
                }
                else {
                  pvVar17 = realloc(*(void **)(local_b8 + 2),(ulong)uVar20 << 4);
                }
              }
              *(void **)(local_b8 + 2) = pvVar17;
              *local_b8 = uVar22;
            }
LAB_006248ad:
            local_b8[1] = uVar4 + 1;
            *(ltlNode **)(*(long *)(local_b8 + 2) + (long)(int)uVar4 * 8) = plVar7;
            *numLtlProcessed = *numLtlProcessed + 1;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < ltlBuffer->nSize);
      }
    }
    putchar(10);
    if (local_b8[1] == 0) {
      puts("\nCurrently aborting, need to take care when Vec_PtrSize( vTopASTNodeArray ) == 0");
      exit(0);
    }
  }
  else {
    local_b8 = (uint *)0x0;
  }
  p_00 = Aig_ManStart(p->vObjs->nSize * 2);
  pcVar11 = pNtk->pName;
  sVar8 = strlen(pcVar11);
  pcVar9 = (char *)malloc(sVar8 + 5);
  p_00->pName = pcVar9;
  sprintf(pcVar9,"%s_%s",pcVar11);
  p_00->pSpec = (char *)0x0;
  pAVar15 = p->pConst1;
  pAVar15->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  if (0 < p->nTruePis) {
    lVar27 = 0;
    do {
      if (p->vCis->nSize <= lVar27) goto LAB_00625c30;
      pAVar15 = (Aig_Obj_t *)p->vCis->pArray[lVar27];
      pAVar10 = Aig_ObjCreateCi(p_00);
      (pAVar15->field_5).pData = pAVar10;
      pVVar5 = vecPis;
      uVar4 = vecPis->nCap;
      if (vecPis->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (vecPis->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vecPis->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          iVar25 = 0x10;
        }
        else {
          iVar25 = uVar4 * 2;
          if (iVar25 <= (int)uVar4) goto LAB_00624a16;
          if (vecPis->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vecPis->pArray,(ulong)uVar4 << 4);
          }
          pVVar5->pArray = ppvVar6;
        }
        pVVar5->nCap = iVar25;
      }
LAB_00624a16:
      iVar25 = pVVar5->nSize;
      pVVar5->nSize = iVar25 + 1;
      pVVar5->pArray[iVar25] = pAVar10;
      if (pNtk->vPis->nSize <= lVar27) goto LAB_00625c30;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vPis->pArray[lVar27]);
      if (pcVar11 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar11);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar11);
      }
      pVVar5 = vecPiNames;
      uVar4 = vecPiNames->nCap;
      if (vecPiNames->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vecPiNames->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          iVar25 = 0x10;
        }
        else {
          iVar25 = uVar4 * 2;
          if (iVar25 <= (int)uVar4) goto LAB_00624ae9;
          if (vecPiNames->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vecPiNames->pArray,(ulong)uVar4 << 4);
          }
          pVVar5->pArray = ppvVar6;
        }
        pVVar5->nCap = iVar25;
      }
LAB_00624ae9:
      iVar25 = pVVar5->nSize;
      pVVar5->nSize = iVar25 + 1;
      pVVar5->pArray[iVar25] = pcVar9;
      lVar27 = lVar27 + 1;
    } while (lVar27 < p->nTruePis);
  }
  if ((mode & 0xfffffffdU) == 0) {
    pAVar10 = Aig_ObjCreateCi(p_00);
    pVVar5 = vecPiNames;
    uVar4 = vecPiNames->nCap;
    if (vecPiNames->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vecPiNames->pArray,0x80);
        }
        pVVar5->pArray = ppvVar6;
        iVar25 = 0x10;
      }
      else {
        iVar25 = uVar4 * 2;
        if (iVar25 <= (int)uVar4) goto LAB_00624b9f;
        if (vecPiNames->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vecPiNames->pArray,(ulong)uVar4 << 4);
        }
        pVVar5->pArray = ppvVar6;
      }
      pVVar5->nCap = iVar25;
    }
LAB_00624b9f:
    iVar25 = pVVar5->nSize;
    pVVar5->nSize = iVar25 + 1;
    pVVar5->pArray[iVar25] = "SAVE_BIERE";
  }
  else {
    pAVar10 = (Aig_Obj_t *)0x0;
  }
  if (0 < p->nRegs) {
    iVar25 = 0;
    do {
      uVar4 = p->nTruePis + iVar25;
      if (((int)uVar4 < 0) || (p->vCis->nSize <= (int)uVar4)) goto LAB_00625c30;
      pAVar15 = (Aig_Obj_t *)p->vCis->pArray[uVar4];
      pAVar12 = Aig_ObjCreateCi(p_00);
      (pAVar15->field_5).pData = pAVar12;
      pVVar5 = vecLos;
      uVar4 = vecLos->nCap;
      if (vecLos->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (vecLos->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vecLos->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          iVar23 = 0x10;
        }
        else {
          iVar23 = uVar4 * 2;
          if (iVar23 <= (int)uVar4) goto LAB_00624c73;
          if (vecLos->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vecLos->pArray,(ulong)uVar4 << 4);
          }
          pVVar5->pArray = ppvVar6;
        }
        pVVar5->nCap = iVar23;
      }
LAB_00624c73:
      iVar23 = pVVar5->nSize;
      pVVar5->nSize = iVar23 + 1;
      pVVar5->pArray[iVar23] = pAVar12;
      uVar4 = pNtk->vPis->nSize + iVar25;
      if (((int)uVar4 < 0) || (pNtk->vCis->nSize <= (int)uVar4)) goto LAB_00625c30;
      pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar4]);
      if (pcVar11 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar11);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar11);
      }
      pVVar5 = vecLoNames;
      uVar4 = vecLoNames->nCap;
      if (vecLoNames->nSize == uVar4) {
        if ((int)uVar4 < 0x10) {
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vecLoNames->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          iVar23 = 0x10;
        }
        else {
          iVar23 = uVar4 * 2;
          if (iVar23 <= (int)uVar4) goto LAB_00624d51;
          if (vecLoNames->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vecLoNames->pArray,(ulong)uVar4 << 4);
          }
          pVVar5->pArray = ppvVar6;
        }
        pVVar5->nCap = iVar23;
      }
LAB_00624d51:
      iVar23 = pVVar5->nSize;
      pVVar5->nSize = iVar23 + 1;
      pVVar5->pArray[iVar23] = pcVar9;
      iVar25 = iVar25 + 1;
    } while (iVar25 < p->nRegs);
  }
  if ((mode & 0xfffffffdU) == 0) {
    local_80 = Aig_ObjCreateCi(p_00);
    pVVar5 = vecLos;
    uVar4 = vecLos->nCap;
    if (vecLos->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (vecLos->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vecLos->pArray,0x80);
        }
        pVVar5->pArray = ppvVar6;
        iVar25 = 0x10;
      }
      else {
        iVar25 = uVar4 * 2;
        if (iVar25 <= (int)uVar4) goto LAB_00624e16;
        if (vecLos->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vecLos->pArray,(ulong)uVar4 << 4);
        }
        pVVar5->pArray = ppvVar6;
      }
      pVVar5->nCap = iVar25;
    }
LAB_00624e16:
    iVar25 = pVVar5->nSize;
    pVVar5->nSize = iVar25 + 1;
    pVVar5->pArray[iVar25] = local_80;
    pVVar5 = vecLoNames;
    uVar4 = vecLoNames->nCap;
    if (vecLoNames->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vecLoNames->pArray,0x80);
        }
        pVVar5->pArray = ppvVar6;
        iVar25 = 0x10;
      }
      else {
        iVar25 = uVar4 * 2;
        if (iVar25 <= (int)uVar4) goto LAB_00624ea0;
        if (vecLoNames->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vecLoNames->pArray,(ulong)uVar4 << 4);
        }
        pVVar5->pArray = ppvVar6;
      }
      pVVar5->nCap = iVar25;
    }
LAB_00624ea0:
    iVar25 = pVVar5->nSize;
    pVVar5->nSize = iVar25 + 1;
    pVVar5->pArray[iVar25] = "SAVED_LO";
  }
  else {
    local_80 = (Aig_Obj_t *)0x0;
  }
  if ((mode & 0xfffffffdU) == 0) {
    local_70 = Aig_Or(p_00,pAVar10,local_80);
    local_90 = Aig_And(p_00,pAVar10,(Aig_Obj_t *)((ulong)local_80 ^ 1));
  }
  else {
    local_90 = (Aig_Obj_t *)0x0;
    local_70 = (Aig_Obj_t *)0x0;
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar27 = 0;
    do {
      pAVar15 = (Aig_Obj_t *)pVVar5->pArray[lVar27];
      if ((pAVar15 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar15->field_0x18 & 7) - 7)) {
        if (((ulong)pAVar15 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar13 = (ulong)pAVar15->pFanin0 & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = (Aig_Obj_t *)((ulong)((uint)pAVar15->pFanin0 & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        uVar13 = (ulong)pAVar15->pFanin1 & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)((ulong)((uint)pAVar15->pFanin1 & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        pAVar10 = Aig_And(p_00,pAVar10,pAVar12);
        (pAVar15->field_5).pData = pAVar10;
      }
      lVar27 = lVar27 + 1;
      pVVar5 = p->vObjs;
    } while (lVar27 < pVVar5->nSize);
  }
  if (2 < (uint)mode) {
    pAVar10 = (Aig_Obj_t *)0x0;
    goto LAB_00625129;
  }
  if (vAssertSafety->nSize == 0) {
LAB_006250a8:
    puts("WARNING!! No safety property is found, a new (negated) constant 1 output is created");
    pAVar12 = p_00->pConst1;
joined_r0x00625116:
    pAVar12 = (Aig_Obj_t *)((ulong)pAVar12 ^ 1);
    pAVar10 = pAVar12;
    if (1 < (uint)mode) goto LAB_00625129;
  }
  else {
    if (vAssumeSafety->nSize == 0) {
      pAVar12 = p_00->pConst1;
      if (0 < vAssertSafety->nSize) {
        lVar27 = 0;
        do {
          pAVar15 = (Aig_Obj_t *)vAssertSafety->pArray[lVar27];
          pAVar12 = Aig_And(p_00,(Aig_Obj_t *)
                                 ((ulong)((uint)pAVar15->pFanin0 & 1) ^
                                 *(ulong *)(((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                            pAVar12);
          lVar27 = lVar27 + 1;
        } while (lVar27 < vAssertSafety->nSize);
      }
      goto joined_r0x00625116;
    }
    if ((vAssertSafety->nSize == 0) || (vAssumeSafety->nSize == 0)) goto LAB_006250a8;
    pAVar12 = p_00->pConst1;
    if (0 < vAssertSafety->nSize) {
      lVar27 = 0;
      do {
        pAVar15 = (Aig_Obj_t *)vAssertSafety->pArray[lVar27];
        pAVar12 = Aig_And(p_00,(Aig_Obj_t *)
                               ((ulong)((uint)pAVar15->pFanin0 & 1) ^
                               *(ulong *)(((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                          pAVar12);
        lVar27 = lVar27 + 1;
      } while (lVar27 < vAssertSafety->nSize);
    }
    pAVar14 = p_00->pConst1;
    if (0 < vAssumeSafety->nSize) {
      lVar27 = 0;
      do {
        pAVar15 = (Aig_Obj_t *)vAssumeSafety->pArray[lVar27];
        pAVar14 = Aig_And(p_00,(Aig_Obj_t *)
                               ((ulong)((uint)pAVar15->pFanin0 & 1) ^
                               *(ulong *)(((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28)),
                          pAVar14);
        lVar27 = lVar27 + 1;
      } while (lVar27 < vAssumeSafety->nSize);
    }
    pAVar10 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar12 ^ 1),pAVar14);
    if (1 < (uint)mode) goto LAB_00625129;
    pAVar12 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar12 ^ 1),pAVar14);
  }
  Aig_ObjCreateCo(p_00,pAVar12);
LAB_00625129:
  if (pAVar10 == (Aig_Obj_t *)0x0) {
    __assert_fail("pNegatedSafetyConjunction != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x7ed,
                  "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                 );
  }
  if ((mode & 0xfffffffdU) == 0) {
    uVar4 = local_b8[1];
    local_78 = (uint *)malloc(0x10);
    uVar20 = 8;
    if (6 < uVar4 - 1) {
      uVar20 = uVar4;
    }
    local_78[1] = 0;
    *local_78 = uVar20;
    if (uVar20 == 0) {
      pvVar17 = (void *)0x0;
    }
    else {
      pvVar17 = malloc((long)(int)uVar20 << 3);
    }
    *(void **)(local_78 + 2) = pvVar17;
    if (0 < (int)local_b8[1]) {
      iVar25 = 0;
      do {
        pAVar12 = Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                                        (((ulong)pAVar15->pFanin0 & 0xfffffffffffffffe) + 0x28));
        uVar4 = local_78[1];
        uVar20 = *local_78;
        if (uVar4 == uVar20) {
          if ((int)uVar20 < 0x10) {
            if (*(void **)(local_78 + 2) == (void *)0x0) {
              pvVar17 = malloc(0x80);
            }
            else {
              pvVar17 = realloc(*(void **)(local_78 + 2),0x80);
            }
            uVar22 = 0x10;
          }
          else {
            uVar22 = uVar20 * 2;
            if ((int)uVar22 <= (int)uVar20) goto LAB_00625236;
            if (*(void **)(local_78 + 2) == (void *)0x0) {
              pvVar17 = malloc((ulong)uVar20 << 4);
            }
            else {
              pvVar17 = realloc(*(void **)(local_78 + 2),(ulong)uVar20 << 4);
            }
          }
          *(void **)(local_78 + 2) = pvVar17;
          *local_78 = uVar22;
        }
LAB_00625236:
        local_78[1] = uVar4 + 1;
        *(Aig_Obj_t **)(*(long *)(local_78 + 2) + (long)(int)uVar4 * 8) = pAVar12;
        iVar25 = iVar25 + 1;
      } while (iVar25 < (int)local_b8[1]);
    }
  }
  else {
    local_78 = (uint *)0x0;
  }
  iVar25 = 0;
  if (0 < p->nRegs) {
    iVar25 = 0;
    do {
      iVar23 = p->nTruePis;
      uVar4 = iVar25 + iVar23;
      if (((int)uVar4 < 0) || (p->vCis->nSize <= (int)uVar4)) goto LAB_00625c30;
      piVar1 = (int *)p->vCis->pArray[uVar4];
      if (((piVar1[6] & 7U) != 2) || (iVar3 = *piVar1, iVar3 < iVar23)) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar4 = (iVar3 - iVar23) + p->nTruePos;
      if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) goto LAB_00625c30;
      uVar13 = *(ulong *)((long)p->vCos->pArray[uVar4] + 8);
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                           ((ulong)((uint)uVar13 & 1) ^
                           *(ulong *)((uVar13 & 0xfffffffffffffffe) + 0x28)));
      iVar25 = iVar25 + 1;
    } while (iVar25 < p->nRegs);
  }
  if ((mode & 0xfffffffdU) == 0) {
    local_68 = Aig_ObjCreateCo(p_00,local_70);
    pAVar15 = p_00->pConst1;
    iVar25 = iVar25 + 1;
    if (0 < p->nRegs) {
      iVar23 = 0;
      do {
        uVar4 = p->nTruePis + iVar23;
        if (((int)uVar4 < 0) || (p->vCis->nSize <= (int)uVar4)) goto LAB_00625c30;
        pvVar17 = p->vCis->pArray[uVar4];
        pAVar12 = Aig_ObjCreateCi(p_00);
        pVVar5 = vecLos;
        uVar4 = vecLos->nCap;
        if (vecLos->nSize == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vecLos->pArray,0x80);
            }
            pVVar5->pArray = ppvVar6;
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar4 * 2;
            if (iVar3 <= (int)uVar4) goto LAB_006253f8;
            if (vecLos->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vecLos->pArray,(ulong)uVar4 << 4);
            }
            pVVar5->pArray = ppvVar6;
          }
          pVVar5->nCap = iVar3;
        }
LAB_006253f8:
        iVar3 = pVVar5->nSize;
        pVVar5->nSize = iVar3 + 1;
        pVVar5->pArray[iVar3] = pAVar12;
        uVar4 = pNtk->vPis->nSize + iVar23;
        if (((int)uVar4 < 0) || (pNtk->vCis->nSize <= (int)uVar4)) goto LAB_00625c30;
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar4]);
        sVar8 = strlen(pcVar11);
        pcVar11 = (char *)malloc(sVar8 + 10);
        uVar4 = pNtk->vPis->nSize + iVar23;
        if (((int)uVar4 < 0) || (pNtk->vCis->nSize <= (int)uVar4)) goto LAB_00625c30;
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pNtk->vCis->pArray[uVar4]);
        sprintf(pcVar11,"%s__%s",pcVar9,"SHADOW");
        pVVar5 = vecLoNames;
        uVar4 = vecLoNames->nCap;
        if (vecLoNames->nSize == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vecLoNames->pArray,0x80);
            }
            pVVar5->pArray = ppvVar6;
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar4 * 2;
            if (iVar3 <= (int)uVar4) goto LAB_00625502;
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vecLoNames->pArray,(ulong)uVar4 << 4);
            }
            pVVar5->pArray = ppvVar6;
          }
          pVVar5->nCap = iVar3;
        }
LAB_00625502:
        iVar3 = pVVar5->nSize;
        pVVar5->nSize = iVar3 + 1;
        pVVar5->pArray[iVar3] = pcVar11;
        pAVar14 = Aig_Mux(p_00,local_90,*(Aig_Obj_t **)((long)pvVar17 + 0x28),pAVar12);
        Aig_ObjCreateCo(p_00,pAVar14);
        pAVar12 = Aig_Exor(p_00,*(Aig_Obj_t **)((long)pvVar17 + 0x28),pAVar12);
        pAVar15 = Aig_And(p_00,(Aig_Obj_t *)((ulong)pAVar12 ^ 1),pAVar15);
        iVar23 = iVar23 + 1;
      } while (iVar23 < p->nRegs);
      iVar25 = iVar25 + iVar23;
    }
    pAVar15 = Aig_And(p_00,local_80,pAVar15);
    puVar16 = (uint *)malloc(0x10);
    puVar16[0] = 10;
    puVar16[1] = 0;
    pvVar17 = malloc(0x50);
    *(void **)(puVar16 + 2) = pvVar17;
    puVar18 = (uint *)malloc(0x10);
    puVar18[0] = 10;
    puVar18[1] = 0;
    pvVar17 = malloc(0x50);
    *(void **)(puVar18 + 2) = pvVar17;
    if (0 < (int)local_b8[1]) {
      lVar27 = 0;
LAB_00625601:
      plVar7 = *(ltlNode **)(*(long *)(local_b8 + 2) + lVar27 * 8);
      pVVar5 = (Vec_Ptr_t *)malloc(0x10);
      pVVar5->nCap = 10;
      pVVar5->nSize = 0;
      ppvVar6 = (void **)malloc(0x50);
      pVVar5->pArray = ppvVar6;
      vAigGFMap = (Vec_Vec_t *)malloc(0x10);
      vAigGFMap->nCap = 10;
      vAigGFMap->nSize = 0;
      ppvVar6 = (void **)malloc(0x50);
      vAigGFMap->pArray = ppvVar6;
      populateBoolWithAigNodePtr(pNtk,p,p_00,plVar7);
      iVar23 = checkAllBoolHaveAIGPointer(plVar7);
      if (iVar23 == 0) {
        __assert_fail("checkAllBoolHaveAIGPointer( topNodeOfAST )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                      ,0x868,
                      "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                     );
      }
      populateAigPointerUnitGF(p_00,plVar7,pVVar5,vAigGFMap);
      if (0 < pVVar5->nSize) {
        uVar4 = puVar16[1];
        lVar26 = 0;
LAB_006256b6:
        pAVar12 = (Aig_Obj_t *)pVVar5->pArray[lVar26];
        if (0 < (int)uVar4) {
          uVar13 = 0;
          do {
            if (*(Aig_Obj_t **)(*(long *)(puVar16 + 2) + uVar13 * 8) == pAVar12) {
              uVar20 = 0xffffffff;
              if ((int)uVar4 < 1) goto LAB_0062578e;
              uVar13 = 0;
              goto LAB_00625756;
            }
            uVar13 = uVar13 + 1;
          } while (uVar4 != uVar13);
        }
        pAVar14 = Aig_ObjCreateCi(p_00);
        pAVar19 = Aig_And(p_00,pAVar12,local_70);
        pAVar19 = Aig_Or(p_00,pAVar14,pAVar19);
        Aig_ObjCreateCo(p_00,pAVar19);
        uVar20 = *puVar16;
        if (uVar4 == uVar20) {
          if ((int)uVar20 < 0x10) {
            if (*(void **)(puVar16 + 2) == (void *)0x0) {
              pvVar17 = malloc(0x80);
            }
            else {
              pvVar17 = realloc(*(void **)(puVar16 + 2),0x80);
            }
            uVar22 = 0x10;
          }
          else {
            uVar22 = uVar20 * 2;
            if ((int)uVar22 <= (int)uVar20) goto LAB_006257ca;
            if (*(void **)(puVar16 + 2) == (void *)0x0) {
              pvVar17 = malloc((ulong)uVar20 << 4);
            }
            else {
              pvVar17 = realloc(*(void **)(puVar16 + 2),(ulong)uVar20 << 4);
            }
          }
          *(void **)(puVar16 + 2) = pvVar17;
          *puVar16 = uVar22;
        }
LAB_006257ca:
        *(Aig_Obj_t **)(*(long *)(puVar16 + 2) + (long)(int)uVar4 * 8) = pAVar12;
        uVar20 = puVar18[1];
        uVar22 = *puVar18;
        if (uVar20 == uVar22) {
          if ((int)uVar22 < 0x10) {
            if (*(void **)(puVar18 + 2) == (void *)0x0) {
              pvVar17 = malloc(0x80);
            }
            else {
              pvVar17 = realloc(*(void **)(puVar18 + 2),0x80);
            }
            uVar24 = 0x10;
          }
          else {
            uVar24 = uVar22 * 2;
            if ((int)uVar24 <= (int)uVar22) goto LAB_0062583a;
            if (*(void **)(puVar18 + 2) == (void *)0x0) {
              pvVar17 = malloc((ulong)uVar22 << 4);
            }
            else {
              pvVar17 = realloc(*(void **)(puVar18 + 2),(ulong)uVar22 << 4);
            }
          }
          *(void **)(puVar18 + 2) = pvVar17;
          *puVar18 = uVar24;
        }
LAB_0062583a:
        puVar18[1] = uVar20 + 1;
        *(Aig_Obj_t **)(*(long *)(puVar18 + 2) + (long)(int)uVar20 * 8) = pAVar14;
        pVVar2 = vecLos;
        uVar20 = vecLos->nCap;
        if (vecLos->nSize == uVar20) {
          if ((int)uVar20 < 0x10) {
            if (vecLos->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vecLos->pArray,0x80);
            }
            pVVar2->pArray = ppvVar6;
            iVar23 = 0x10;
          }
          else {
            iVar23 = uVar20 * 2;
            if (iVar23 <= (int)uVar20) goto LAB_006258d1;
            if (vecLos->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar20 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vecLos->pArray,(ulong)uVar20 << 4);
            }
            pVVar2->pArray = ppvVar6;
          }
          pVVar2->nCap = iVar23;
        }
LAB_006258d1:
        iVar23 = pVVar2->nSize;
        pVVar2->nSize = iVar23 + 1;
        pVVar2->pArray[iVar23] = pAVar14;
        pcVar11 = (char *)malloc(0x14);
        sprintf(pcVar11,"n%d__%s",(ulong)(uint)pAVar14->Id,"GF_flop");
        pVVar2 = vecLoNames;
        uVar20 = vecLoNames->nCap;
        if (vecLoNames->nSize == uVar20) {
          if ((int)uVar20 < 0x10) {
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vecLoNames->pArray,0x80);
            }
            pVVar2->pArray = ppvVar6;
            iVar23 = 0x10;
          }
          else {
            iVar23 = uVar20 * 2;
            if (iVar23 <= (int)uVar20) goto LAB_00625986;
            if (vecLoNames->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar20 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(vecLoNames->pArray,(ulong)uVar20 << 4);
            }
            pVVar2->pArray = ppvVar6;
          }
          pVVar2->nCap = iVar23;
        }
LAB_00625986:
        iVar25 = iVar25 + 1;
        uVar4 = uVar4 + 1;
        iVar23 = pVVar2->nSize;
        pVVar2->nSize = iVar23 + 1;
        pVVar2->pArray[iVar23] = pcVar11;
        goto LAB_006259ac;
      }
      goto LAB_00625a16;
    }
  }
  else {
    local_68 = (Aig_Obj_t *)0x0;
  }
LAB_00625b34:
  Aig_ManSetRegNum(p_00,iVar25);
  iVar25 = p_00->vCis->nSize;
  p_00->nObjs[2] = iVar25;
  iVar23 = p_00->nRegs;
  if (iVar23 != 0) {
    p_00->nTruePis = iVar25 - iVar23;
  }
  iVar25 = p_00->vCos->nSize;
  p_00->nObjs[3] = iVar25;
  if (iVar23 != 0) {
    p_00->nTruePos = iVar25 - iVar23;
  }
  Aig_ManCleanup(p_00);
  iVar25 = Aig_ManCheck(p_00);
  if (iVar25 == 0) {
    __assert_fail("Aig_ManCheck( pNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x8cf,
                  "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                 );
  }
  if ((mode & 0xfffffffdU) == 0) {
    if (0xfffffffd < (*(uint *)&local_80->field_0x18 & 7) - 7) {
      __assert_fail("!Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
    }
    uVar4 = ~p->nTruePis + (local_80->field_0).CioId + p_00->nTruePos;
    if (((int)uVar4 < 0) || (p_00->vCos->nSize <= (int)uVar4)) {
LAB_00625c30:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((Aig_Obj_t *)p_00->vCos->pArray[uVar4] != local_68) {
      __assert_fail("(Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x8d3,
                    "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                   );
    }
    if (p->nTruePis + 1U != p_00->nTruePis) {
      __assert_fail("Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x8d4,
                    "Aig_Man_t *LivenessToSafetyTransformationWithLTL(int, Abc_Ntk_t *, Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, Vec_Ptr_t *)"
                   );
    }
  }
  return p_00;
  while (uVar13 = uVar13 + 1, uVar4 != uVar13) {
LAB_00625756:
    if (*(Aig_Obj_t **)(*(long *)(puVar16 + 2) + uVar13 * 8) == pAVar12) {
      uVar20 = (uint)uVar13;
      break;
    }
  }
LAB_0062578e:
  if (((int)uVar20 < 0) || ((int)puVar18[1] <= (int)uVar20)) {
    puVar16[1] = uVar4;
    goto LAB_00625c30;
  }
  pAVar14 = *(Aig_Obj_t **)(*(long *)(puVar18 + 2) + (ulong)uVar20 * 8);
LAB_006259ac:
  if (vAigGFMap->nSize <= lVar26) {
LAB_00625bfe:
    puVar16[1] = uVar4;
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  lVar21 = 0;
  while (lVar21 < *(int *)((long)vAigGFMap->pArray[lVar26] + 4)) {
    setAIGNodePtrOfGloballyNode
              (*(ltlNode **)(*(long *)((long)vAigGFMap->pArray[lVar26] + 8) + lVar21 * 8),pAVar14);
    lVar21 = lVar21 + 1;
    if (vAigGFMap->nSize <= lVar26) goto LAB_00625bfe;
  }
  lVar26 = lVar26 + 1;
  if (pVVar5->nSize <= lVar26) goto code_r0x00625a02;
  goto LAB_006256b6;
code_r0x00625a02:
  puVar16[1] = uVar4;
LAB_00625a16:
  buildLogicFromLTLNode(p_00,plVar7);
  pAVar12 = retriveAIGPointerFromLTLNode(plVar7);
  pAVar12 = Aig_And(p_00,pAVar15,(Aig_Obj_t *)((ulong)pAVar12 ^ 1));
  puts("liveness output is conjoined with safety assertions");
  pAVar12 = Aig_Or(p_00,pAVar12,pAVar10);
  if ((int)local_78[1] <= lVar27) goto LAB_00625c30;
  Aig_ObjPatchFanin0(p_00,*(Aig_Obj_t **)(*(long *)(local_78 + 2) + lVar27 * 8),pAVar12);
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  free(pVVar5);
  if (0 < vAigGFMap->nSize) {
    lVar26 = 0;
    do {
      pvVar17 = vAigGFMap->pArray[lVar26];
      if (pvVar17 != (void *)0x0) {
        if (*(void **)((long)pvVar17 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar17 + 8));
          *(undefined8 *)((long)pvVar17 + 8) = 0;
        }
        free(pvVar17);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < vAigGFMap->nSize);
  }
  if (vAigGFMap->pArray != (void **)0x0) {
    free(vAigGFMap->pArray);
    vAigGFMap->pArray = (void **)0x0;
  }
  free(vAigGFMap);
  lVar27 = lVar27 + 1;
  if ((int)local_b8[1] <= lVar27) goto LAB_00625b34;
  goto LAB_00625601;
}

Assistant:

Aig_Man_t * LivenessToSafetyTransformationWithLTL( int mode, Abc_Ntk_t * pNtk, Aig_Man_t * p, 
                                           Vec_Ptr_t *vLive, Vec_Ptr_t *vFair, Vec_Ptr_t *vAssertSafety, Vec_Ptr_t *vAssumeSafety,
                                           int *numLtlProcessed, Vec_Ptr_t *ltlBuffer )
{
    Aig_Man_t * pNew;
    int i, ii, iii, nRegCount;
    Aig_Obj_t * pObjSavePi = NULL;
    Aig_Obj_t *pObjSavedLo = NULL, *pObjSavedLi = NULL;
    Aig_Obj_t *pObj, *pMatch;
    Aig_Obj_t *pObjSaveOrSaved = NULL, *pObjSaveAndNotSaved = NULL, *pObjSavedLoAndEquality;
    Aig_Obj_t *pObjShadowLo, *pObjShadowLi, *pObjShadowLiDriver;
    Aig_Obj_t *pObjXor, *pObjXnor, *pObjAndAcc;
    Aig_Obj_t *pObjLive, *pObjSafetyGate;
    Aig_Obj_t *pObjSafetyPropertyOutput;
    Aig_Obj_t *pObjOriginalSafetyPropertyOutput;
    Aig_Obj_t *pDriverImage, *pArgument, *collectiveAssertSafety, *collectiveAssumeSafety;
    Aig_Obj_t *pNegatedSafetyConjunction = NULL;
    Aig_Obj_t *pObjSafetyAndLiveToSafety;
    char *nodeName, *pFormula;
    int piCopied = 0, liCopied = 0, loCopied = 0, liCreated = 0, loCreated = 0, liveLatch = 0;//, piVecIndex = 0, fairLatch = 0;
    Vec_Ptr_t *vSignal, *vTopASTNodeArray = NULL;
    ltlNode *pEnrtyGLOBALLY;
    ltlNode *topNodeOfAST, *tempTopASTNode;
    Vec_Vec_t *vAigGFMap;
    Vec_Ptr_t *vSignalMemory, *vGFFlopMemory, *vPoForLtlProps = NULL;
    Vec_Ptr_t *vecInputLtlFormulae;
    
    vecPis = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);
    vecPiNames = Vec_PtrAlloc( Saig_ManPiNum( p ) + 1);

    vecLos = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );
    vecLoNames = Vec_PtrAlloc( Saig_ManRegNum( p )*2 + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) );

    //****************************************************************
    //step0: Parsing the LTL formula
    //****************************************************************
    //Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pFormula, i )
    //    printf("\ninput LTL formula [%d] = %s\n", i, pFormula );


#ifdef MULTIPLE_LTL_FORMULA


    //***************************************************************************
    //Reading input LTL formulae from Ntk data-structure and creating 
    //AST for them, Steps involved: 
    //        parsing -> AST creation -> well-formedness check -> signal name check
    //***************************************************************************

    //resetting numLtlProcessed
    *numLtlProcessed = 0;
    
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
        //if( ltlBuffer )
        vecInputLtlFormulae = ltlBuffer;
        //vecInputLtlFormulae = pNtk->vLtlProperties;
        if( vecInputLtlFormulae )
        {
            vTopASTNodeArray = Vec_PtrAlloc( Vec_PtrSize( vecInputLtlFormulae ) );
            printf("\n");
            Vec_PtrForEachEntry( char *, vecInputLtlFormulae, pFormula, i )
            {
                tempTopASTNode = parseFormulaCreateAST( pFormula );
                //traverseAbstractSyntaxTree_postFix( tempTopASTNode );
                if( tempTopASTNode )
                {
                    printf("Formula %d: AST is created, ", i+1);
                    if( isWellFormed( tempTopASTNode ) )
                        printf("Well-formedness check PASSED, ");
                    else
                    {
                        printf("Well-formedness check FAILED!!\n");
                        printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n", i+1 );
                        //do memory management to free the created AST
                        continue;
                    }
                    if( checkSignalNameExistence( pNtk, tempTopASTNode ) )
                        printf("Signal check PASSED\n");
                    else
                    {
                        printf("Signal check FAILED!!");
                        printf("AST will be ignored for formula %d, no extra logic will be added for this formula\n", i+1 );
                        //do memory management to free the created AST
                        continue;
                    }
                    Vec_PtrPush( vTopASTNodeArray, tempTopASTNode );
                    (*numLtlProcessed)++;
                }
                else
                    printf("\nNo AST has been created for formula %d, no extra logic will be added\n", i+1 );
            }
        }
        printf("\n");
        if( Vec_PtrSize( vTopASTNodeArray ) == 0 )
        {
            //printf("\nNo AST has been created for any formula; hence the circuit is left untouched\n");
            printf("\nCurrently aborting, need to take care when Vec_PtrSize( vTopASTNodeArray ) == 0\n");
            exit(0);
        }
    }

        //****************************************************************
        // Step1: create the new manager
        // Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
        // nodes, but this selection is arbitrary - need to be justified
        //****************************************************************
        pNew = Aig_ManStart( 2 * Aig_ManObjNumMax(p) );
        pNew->pName = (char *)malloc( strlen( pNtk->pName ) + strlen("_l3s") + 1 );
        sprintf(pNew->pName, "%s_%s", pNtk->pName, "l3s");
        pNew->pSpec = NULL;
    
        //****************************************************************
        // Step 2: map constant nodes
        //****************************************************************
        pObj = Aig_ManConst1( p );
        pObj->pData = Aig_ManConst1( pNew );

        //****************************************************************
        // Step 3: create true PIs
        //****************************************************************
        Saig_ManForEachPi( p, pObj, i )
        {
            piCopied++;
            pObj->pData = Aig_ObjCreateCi(pNew);
            Vec_PtrPush( vecPis, pObj->pData );
            nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkPi( pNtk, i ) ));
            Vec_PtrPush( vecPiNames, nodeName );
        }

        //****************************************************************
        // Step 4: create the special Pi corresponding to SAVE
        //****************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            pObjSavePi = Aig_ObjCreateCi( pNew );
            nodeName = "SAVE_BIERE",
            Vec_PtrPush( vecPiNames, nodeName );
        }
        
        //****************************************************************
        // Step 5: create register outputs
        //****************************************************************
        Saig_ManForEachLo( p, pObj, i )
        {
            loCopied++;
            pObj->pData = Aig_ObjCreateCi(pNew);
            Vec_PtrPush( vecLos, pObj->pData );
            nodeName = Abc_UtilStrsav(Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ));
            Vec_PtrPush( vecLoNames, nodeName );
        }

        //****************************************************************
        // Step 6: create "saved" register output
        //****************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            loCreated++;
            pObjSavedLo = Aig_ObjCreateCi( pNew );
            Vec_PtrPush( vecLos, pObjSavedLo );
            nodeName = "SAVED_LO";
            Vec_PtrPush( vecLoNames, nodeName );
        }

        //****************************************************************
        // Step 7: create the OR gate and the AND gate directly fed by "SAVE" Pi
        //****************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            pObjSaveOrSaved = Aig_Or( pNew, pObjSavePi, pObjSavedLo );
            pObjSaveAndNotSaved = Aig_And( pNew, pObjSavePi, Aig_Not(pObjSavedLo) );
        }

        //********************************************************************
        // Step 8: create internal nodes
        //********************************************************************
        Aig_ManForEachNode( p, pObj, i )
        {
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        }

        
        //********************************************************************
        // Step 8.x : create PO for each safety assertions
        // NOTE : Here the output is purposely inverted as it will be thrown to 
        // dprove
        //********************************************************************
        assert( pNegatedSafetyConjunction == NULL );
        if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE)
        {
            if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) == 0 )
            {
                pObjAndAcc = Aig_ManConst1( pNew );
                Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
                {
                    pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                    pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
                }
                pNegatedSafetyConjunction = Aig_Not(pObjAndAcc);
                if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                    pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not(pObjAndAcc) );
            }
            else if( Vec_PtrSize( vAssertSafety ) != 0 && Vec_PtrSize( vAssumeSafety ) != 0 )
            {
                pObjAndAcc = Aig_ManConst1( pNew );
                Vec_PtrForEachEntry( Aig_Obj_t *, vAssertSafety, pObj, i )
                {
                    pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                    pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
                }
                collectiveAssertSafety = pObjAndAcc;

                pObjAndAcc = Aig_ManConst1( pNew );
                Vec_PtrForEachEntry( Aig_Obj_t *, vAssumeSafety, pObj, i )
                {
                    pArgument = Aig_NotCond( (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0( pObj ) );
                    pObjAndAcc = Aig_And( pNew, pArgument, pObjAndAcc );
                }
                collectiveAssumeSafety = pObjAndAcc;
                pNegatedSafetyConjunction =  Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety );
                if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                    pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_And( pNew, Aig_Not(collectiveAssertSafety), collectiveAssumeSafety ) );
            }
            else
            {
                printf("WARNING!! No safety property is found, a new (negated) constant 1 output is created\n");
                pNegatedSafetyConjunction = Aig_Not( Aig_ManConst1(pNew) );
                if( mode == FULL_BIERE_MODE || mode == IGNORE_LIVENESS_KEEP_SAFETY_MODE )
                    pObjOriginalSafetyPropertyOutput = Aig_ObjCreateCo( pNew, Aig_Not( Aig_ManConst1(pNew) ) );
            }
        }
        assert( pNegatedSafetyConjunction != NULL );

        //********************************************************************
        // Step 9: create the safety property output gate for the liveness properties
        // discuss with Sat/Alan for an alternative implementation
        //********************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            vPoForLtlProps = Vec_PtrAlloc( Vec_PtrSize( vTopASTNodeArray ) );
            if( Vec_PtrSize( vTopASTNodeArray ) )
            {
                //no effective AST for any input LTL property
                //must do something graceful
            }
            for( i=0; i<Vec_PtrSize( vTopASTNodeArray ); i++ )
            {
                pObjSafetyPropertyOutput = Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData );
                Vec_PtrPush( vPoForLtlProps, pObjSafetyPropertyOutput );
            }
        }

        //*************************************************************************************
        // Step 10: Placeholder PO's were created for Liveness property outputs in the
        // last step. FYI, # of new liveness property outputs = # of LTL properties in the circuit
        // It is time for creation of loop LI's and other stuff
        // Now creating register inputs for the original flops
        //*************************************************************************************
        nRegCount = 0;
        
        Saig_ManForEachLo( p, pObj, i )
        {
            pMatch = Saig_ObjLoToLi( p, pObj );
            Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pMatch)->pData, Aig_ObjFaninC0( pMatch ) ) );
            nRegCount++;
            liCopied++;
        }

        //*************************************************************************************
        // Step 11: create register input corresponding to the register "saved"
        //*************************************************************************************
        if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
        {
            #ifndef DUPLICATE_CKT_DEBUG
                pObjSavedLi = Aig_ObjCreateCo( pNew, pObjSaveOrSaved );
                nRegCount++;
                liCreated++;

                pObjAndAcc = Aig_ManConst1( pNew );

                //*************************************************************************************
                // Step 11: create the family of shadow registers, then create the cascade of Xnor 
                // and And gates for the comparator 
                //*************************************************************************************
                Saig_ManForEachLo( p, pObj, i )
                {
                //printf("\nKEMON RENDY = %s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i )) );
                //top|route0_target0_queue_with_credit0_queue0
                //top|route0_master0_queue2
                //    if( strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[0]" ) == 0 
                //            || strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[1]" ) == 0 || strcmp(  Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "top|route0_queue1_num[2]" ) == 0 )
                    {        
                        pObjShadowLo = Aig_ObjCreateCi( pNew );

                    #ifdef PROPAGATE_NAMES
                        Vec_PtrPush( vecLos, pObjShadowLo );
                        nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ) ) + 10 );
                        sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkCi( pNtk, Abc_NtkPiNum(pNtk) + i ) ), "SHADOW" );
                        
                        Vec_PtrPush( vecLoNames, nodeName );
                    #endif

                        pObjShadowLiDriver = Aig_Mux( pNew, pObjSaveAndNotSaved, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                        pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );
                        nRegCount++;
                        loCreated++; liCreated++;
            
                        pObjXor = Aig_Exor( pNew, (Aig_Obj_t *)pObj->pData, pObjShadowLo );
                        pObjXnor = Aig_Not( pObjXor );
                    
                        pObjAndAcc = Aig_And( pNew, pObjXnor, pObjAndAcc );
                    }
                }

                // create the AND gate whose output will be the signal "looped"
                pObjSavedLoAndEquality = Aig_And( pNew, pObjSavedLo, pObjAndAcc );

                // create the master AND gate and corresponding AND and OR logic for the liveness properties
                
                //*************************************************************************************
                // Step 11: logic for LTL properties:- (looped & ~theta) where theta is the input ltl 
                // property
                // Description of some data-structure:
                //-------------------------------------------------------------------------------------
                // Name          | Type            | Purpose
                //-------------------------------------------------------------------------------------
                // vSignalMemory | Vec_Ptr_t *     | A vector across all ASTs of the LTL properties
                //                 |                   | It remembers if OR+Latch for GF node has already been
                //                 |                   | created for a particular signal.
                //               |                 |
                // vGFFlopMemory | Vec_Ptr_t *     | A vector across all ASTs of the LTL properties
                //                 |                 | remembers if OR+Latch of a GF node has already been created
                //                 |                 |
                // vSignal         | Vec_Ptr_t *     | vector for each AST; contains pointers from GF nodes
                //               |                 | to AIG signals
                //                 |                   |
                // vAigGFMap     | Vec_Vec_t *     | vAigGFMap[ index ] = vector of GF nodes pointing to
                //               |                 | the same AIG node; "index" is the index of that
                //               |                 | AIG node in the vector vSignal
                //*************************************************************************************
                
                vSignalMemory = Vec_PtrAlloc(10);
                vGFFlopMemory = Vec_PtrAlloc(10);

                Vec_PtrForEachEntry( ltlNode *, vTopASTNodeArray, topNodeOfAST, iii )
                {
                                    vSignal = Vec_PtrAlloc( 10 );
                                    vAigGFMap = Vec_VecAlloc( 10 );
                                    
                                    //*************************************************************************************
                                    //Step 11a: for the current AST, find out the leaf level Boolean signal pointers from 
                                    // the NEW aig.
                                    //*************************************************************************************
                                    populateBoolWithAigNodePtr( pNtk, p, pNew, topNodeOfAST );
                                    assert( checkAllBoolHaveAIGPointer( topNodeOfAST ) );

                                    //*************************************************************************************
                                    //Step 11b: for each GF node, compute the pointer in AIG that it should point to
                                    // In particular, if the subtree below GF is some Boolean crown (including the case
                                    // of simple negation, create new logic and populate the AIG pointer in GF node
                                    // accordingly
                                    //*************************************************************************************
                                    populateAigPointerUnitGF( pNew, topNodeOfAST, vSignal, vAigGFMap );
                                    
                                    //*************************************************************************************
                                    //Step 11c: everything below GF are computed. Now, it is time to create logic for individual 
                                    // GF nodes (i.e. the OR gate and the latch and the Boolean crown of the AST
                                    //*************************************************************************************
                                    Vec_PtrForEachEntry( Aig_Obj_t *, vSignal, pObj, i )
                                    {
                                        //*********************************************************
                                        // Step 11c.1: if the OR+Latch of the particular signal is
                                        // not already created, create it. It may have already been 
                                        // created from another property, so check it before creation
                                        //*********************************************************
                                        if( Vec_PtrFind( vSignalMemory, pObj ) == -1 )
                                        {
                                            liveLatch++;

                                            pDriverImage = pObj;
                                            pObjShadowLo = Aig_ObjCreateCi( pNew );
                                            pObjShadowLiDriver = Aig_Or( pNew, pObjShadowLo, Aig_And( pNew, pDriverImage, pObjSaveOrSaved ) );
                                            pObjShadowLi = Aig_ObjCreateCo( pNew, pObjShadowLiDriver );

                                            nRegCount++;
                                            loCreated++; liCreated++;

                                            Vec_PtrPush( vSignalMemory, pObj );
                                            Vec_PtrPush( vGFFlopMemory, pObjShadowLo );

                                            #if 1
                                            #ifdef PROPAGATE_NAMES
                                                Vec_PtrPush( vecLos, pObjShadowLo );
                                                //nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                                                //sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
                                                nodeName = (char *)malloc( 20 );
                                                sprintf( nodeName, "n%d__%s", Aig_ObjId(pObjShadowLo), "GF_flop" );
                                                Vec_PtrPush( vecLoNames, nodeName );
                                            #endif
                                            #endif
                                        }
                                        else
                                            pObjShadowLo = (Aig_Obj_t *)Vec_PtrEntry( vGFFlopMemory, Vec_PtrFind( vSignalMemory, pObj ) );
                                                                                
                                        Vec_VecForEachEntryLevel( ltlNode *, vAigGFMap, pEnrtyGLOBALLY, ii, i )
                                            setAIGNodePtrOfGloballyNode( pEnrtyGLOBALLY, pObjShadowLo);
                                            

                                        //#ifdef PROPAGATE_NAMES
                                        //    Vec_PtrPush( vecLos, pObjShadowLo );
                                        //    nodeName = (char *)malloc( strlen( Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ) ) + 12 );
                                        //    sprintf( nodeName, "%s__%s", Abc_ObjName( Abc_NtkPo( pNtk, getPoIndex( p, pObj ) ) ), "LIVENESS" );
                                        //    Vec_PtrPush( vecLoNames, nodeName );
                                        //#endif
                                        
                                    }
                                    
                                    //*********************************************************
                                    //Step 11c.2: creating the Boolean crown
                                    //*********************************************************
                                    buildLogicFromLTLNode( pNew, topNodeOfAST );

                                    //*********************************************************
                                    //Step 11c.3: creating logic for (looped & ~theta) and patching
                                    // it with the proper PO
                                    //Note: if ALLOW_SAFETY_PROPERTIES is defined then the final AND
                                    //gate is a conjunction of safety & liveness, i.e. SAFETY & (looped => theta)
                                    //since ABC convention demands a NOT gate at the end, the property logic 
                                    //becomes !( SAFETY & (looped => theta) ) = !SAFETY + (looped & !theta)
                                    //*********************************************************
                                    pObjLive = retriveAIGPointerFromLTLNode( topNodeOfAST );
                                    pObjSafetyGate = Aig_And( pNew, pObjSavedLoAndEquality, Aig_Not(pObjLive) );
                                    #ifdef ALLOW_SAFETY_PROPERTIES
                                        printf("liveness output is conjoined with safety assertions\n");
                                        pObjSafetyAndLiveToSafety = Aig_Or( pNew, pObjSafetyGate, pNegatedSafetyConjunction );
                                        pObjSafetyPropertyOutput = (Aig_Obj_t *)Vec_PtrEntry( vPoForLtlProps, iii );
                                        Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyAndLiveToSafety );
                                    #else
                                        pObjSafetyPropertyOutput = Vec_PtrEntry( vPoForLtlProps, iii );
                                        Aig_ObjPatchFanin0( pNew, pObjSafetyPropertyOutput, pObjSafetyGate );
                                    #endif
                                    //refreshing vSignal and vAigGFMap arrays
                                    Vec_PtrFree( vSignal );
                                    Vec_VecFree( vAigGFMap );
                }
                                
            #endif
        }
#endif

    Aig_ManSetRegNum( pNew, nRegCount );

    Aig_ManCiCleanupBiere( pNew );
    Aig_ManCoCleanupBiere( pNew );
    
    Aig_ManCleanup( pNew );
    
    assert( Aig_ManCheck( pNew ) );
    
    if( mode == FULL_BIERE_MODE || mode == IGNORE_SAFETY_KEEP_LIVENESS_MODE )
    {
            assert((Aig_Obj_t *)Vec_PtrEntry(pNew->vCos, Saig_ManPoNum(pNew)+Aig_ObjCioId(pObjSavedLo)-Saig_ManPiNum(p)-1) == pObjSavedLi);
            assert( Saig_ManPiNum( p ) + 1 == Saig_ManPiNum( pNew ) );
            //assert( Saig_ManRegNum( pNew ) == Saig_ManRegNum( p ) * 2 + 1 + liveLatch + fairLatch );
    }


    return pNew;
}